

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlstring.c
# Opt level: O1

void EBML_StringGet(ebml_string *Element,tchar_t *Out,size_t OutLen)

{
  bool_t bVar1;
  
  if (Element->Buffer == (char *)0x0) {
    if (OutLen != 0) {
      *Out = '\0';
    }
    return;
  }
  bVar1 = Node_IsPartOf(Element,0x55534245);
  if (bVar1 != 0) {
    Node_FromUTF8(Element,Out,OutLen,Element->Buffer);
    return;
  }
  Node_FromStr(Element,Out,OutLen,Element->Buffer);
  return;
}

Assistant:

void EBML_StringGet(ebml_string *Element,tchar_t *Out, size_t OutLen)
{
    if (!Element->Buffer)
    {
        if (OutLen)
            *Out = 0;
    }
    else
    {
        if (Node_IsPartOf(Element,EBML_UNISTRING_CLASS))
            Node_FromUTF8(Element,Out,OutLen,Element->Buffer);
        else
            Node_FromStr(Element,Out,OutLen,Element->Buffer);
    }
}